

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  size_t *psVar1;
  Counts *pCVar2;
  IStreamingReporter *pIVar3;
  size_t sVar4;
  int iVar5;
  SectionTracker *pSVar6;
  IMutableContext *pIVar7;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCaseInfo testInfo;
  string local_358;
  string local_338;
  TestCase **local_318;
  Totals *local_310;
  Totals local_308;
  TestCaseInfo local_2d0;
  TestCaseStats local_1c0;
  
  local_308.assertions.passed = (this->m_totals).assertions.passed;
  local_308.assertions.failed = (this->m_totals).assertions.failed;
  local_308.assertions.failedButOk = (this->m_totals).assertions.failedButOk;
  local_308.testCases.passed = (this->m_totals).testCases.passed;
  local_308.testCases.failed = (this->m_totals).testCases.failed;
  local_308.testCases.failedButOk = (this->m_totals).testCases.failedButOk;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  local_338._M_string_length = 0;
  local_338.field_2._M_local_buf[0] = '\0';
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  local_358._M_string_length = 0;
  local_358.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_2d0,&testCase->super_TestCaseInfo);
  pIVar3 = (this->m_reporter).m_p;
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar3,&local_2d0);
  local_310 = &this->m_totals;
  local_318 = &this->m_activeTestCase;
  this->m_activeTestCase = testCase;
  do {
    TestCaseTracking::TrackerContext::startRun(&this->m_trackerContext);
    do {
      (this->m_trackerContext).m_currentTracker = (this->m_trackerContext).m_rootTracker.m_p;
      (this->m_trackerContext).m_runState = Executing;
      pSVar6 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_2d0.name);
      this->m_testCaseTracker = (ITracker *)pSVar6;
      runCurrentTest(this,&local_338,&local_358);
      iVar5 = (*(this->m_testCaseTracker->super_SharedImpl<Catch::IShared>).super_IShared.
                super_NonCopyable._vptr_NonCopyable[6])();
      if ((char)iVar5 != '\0') break;
      iVar5 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
    } while ((char)iVar5 == '\0');
    pIVar7 = getCurrentMutableContext();
    iVar5 = (*(pIVar7->super_IContext)._vptr_IContext[5])(pIVar7);
    if ((char)iVar5 == '\0') break;
    iVar5 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  } while ((char)iVar5 == '\0');
  Totals::delta(__return_storage_ptr__,local_310,&local_308);
  sVar4 = (__return_storage_ptr__->testCases).passed;
  if ((sVar4 != 0 & (byte)(undefined1)local_2d0.properties >> 2) == 1) {
    psVar1 = &(__return_storage_ptr__->assertions).failed;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->testCases).passed = sVar4 - 1;
    psVar1 = &(__return_storage_ptr__->testCases).failed;
    *psVar1 = *psVar1 + 1;
  }
  pCVar2 = &(this->m_totals).testCases;
  pCVar2->passed = pCVar2->passed + (__return_storage_ptr__->testCases).passed;
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + (__return_storage_ptr__->testCases).failed;
  psVar1 = &(this->m_totals).testCases.failedButOk;
  *psVar1 = *psVar1 + (__return_storage_ptr__->testCases).failedButOk;
  pIVar3 = (this->m_reporter).m_p;
  iVar5 = (*(this->super_IResultCapture)._vptr_IResultCapture[0xb])(this);
  TestCaseStats::TestCaseStats
            (&local_1c0,&local_2d0,__return_storage_ptr__,&local_338,&local_358,SUB41(iVar5,0));
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar3,&local_1c0);
  TestCaseStats::~TestCaseStats(&local_1c0);
  *local_318 = (TestCase *)0x0;
  local_318[1] = (TestCase *)0x0;
  TestCaseInfo::~TestCaseInfo(&local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,
                    CONCAT71(local_358.field_2._M_allocated_capacity._1_7_,
                             local_358.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,
                    CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                             local_338.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;

            do {
                m_trackerContext.startRun();
                do {
                    m_trackerContext.startCycle();
                    m_testCaseTracker = &SectionTracker::acquire( m_trackerContext, testInfo.name );
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isSuccessfullyCompleted() && !aborting() );
            }
            // !TBD: deprecated - this will be replaced by indexed trackers
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            if( testInfo.expectedToFail() && deltaTotals.testCases.passed > 0 ) {
                deltaTotals.assertions.failed++;
                deltaTotals.testCases.passed--;
                deltaTotals.testCases.failed++;
            }
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = CATCH_NULL;
            m_testCaseTracker = CATCH_NULL;

            return deltaTotals;
        }